

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

TextClassifier * __thiscall CoreML::Specification::Model::mutable_textclassifier(Model *this)

{
  TextClassifier *this_00;
  
  if (this->_oneof_case_[0] == 2000) {
    this_00 = (TextClassifier *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 2000;
    this_00 = (TextClassifier *)operator_new(0x38);
    CoreMLModels::TextClassifier::TextClassifier(this_00);
    (this->Type_).textclassifier_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::CoreMLModels::TextClassifier* Model::mutable_textclassifier() {
  if (!has_textclassifier()) {
    clear_Type();
    set_has_textclassifier();
    Type_.textclassifier_ = new ::CoreML::Specification::CoreMLModels::TextClassifier;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.textClassifier)
  return Type_.textclassifier_;
}